

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# barray.c
# Opt level: O3

int bit_array_test(void *array,size_t bit)

{
  int iVar1;
  
  iVar1 = 0;
  if ((array != (void *)0x0) &&
     ((*array <= bit ||
      (iVar1 = 1, (*(byte *)((long)array + (bit >> 3) + 8) >> ((uint)bit & 7) & 1) == 0)))) {
    return 0;
  }
  return iVar1;
}

Assistant:

int bit_array_test(void * array, size_t bit)
{
	if (array)
	{
		size_t * size = (size_t *) array;
		if (bit < *size)
		{
			unsigned char * ptr = (unsigned char *)(size + 1);
			if (ptr[bit >> 3] & (1U << (bit & 7)))
			{
				return 1;
			}
		}
	}
	return 0;
}